

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

int input_huffman(uchar *infile)

{
  int iVar1;
  uint uVar2;
  
  if (bits_to_go < 3) {
    buffer2 = (uint)infile[nextchar] | buffer2 << 8;
    nextchar = nextchar + 1;
    bits_to_go = bits_to_go + 8;
  }
  bits_to_go = bits_to_go + -3;
  uVar2 = buffer2 >> ((byte)bits_to_go & 0x1f) & 7;
  if (uVar2 < 4) {
    uVar2 = 1 << (sbyte)uVar2;
  }
  else {
    iVar1 = input_bit(infile);
    uVar2 = iVar1 + uVar2 * 2;
    if (0xc < uVar2) {
      iVar1 = input_bit(infile);
      iVar1 = (*(code *)(&DAT_001d42c4 +
                        *(int *)(&DAT_001d42c4 + (ulong)((iVar1 + uVar2 * 2) - 0x1a) * 4)))();
      return iVar1;
    }
    uVar2 = (&UINT_001d4404)[(int)uVar2];
  }
  return uVar2;
}

Assistant:

static int input_huffman(unsigned char *infile)
{
int c;

	/*
	 * get first 3 bits to start
	 */
	c = input_nbits(infile,3);
	if (c < 4) {
		/*
		 * this is all we need
		 * return 1,2,4,8 for c=0,1,2,3
		 */
		return(1<<c);
	}
	/*
	 * get the next bit
	 */
	c = input_bit(infile) | (c<<1);
	if (c < 13) {
		/*
		 * OK, 4 bits is enough
		 */
		switch (c) {
			case  8 : return(3);
			case  9 : return(5);
			case 10 : return(10);
			case 11 : return(12);
			case 12 : return(15);
		}
	}
	/*
	 * get yet another bit
	 */
	c = input_bit(infile) | (c<<1);
	if (c < 31) {
		/*
		 * OK, 5 bits is enough
		 */
		switch (c) {
			case 26 : return(6);
			case 27 : return(7);
			case 28 : return(9);
			case 29 : return(11);
			case 30 : return(13);
		}
	}
	/*
	 * need the 6th bit
	 */
	c = input_bit(infile) | (c<<1);
	if (c == 62) {
		return(0);
	} else {
		return(14);
	}
}